

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

ERR_STATE * err_get_state(void)

{
  int iVar1;
  ERR_STATE *pEVar2;
  ERR_STATE *value;
  
  pEVar2 = (ERR_STATE *)CRYPTO_get_thread_local(OPENSSL_THREAD_LOCAL_ERR);
  if (pEVar2 == (ERR_STATE *)0x0) {
    value = (ERR_STATE *)calloc(1,400);
    if (value == (ERR_STATE *)0x0) {
      pEVar2 = (ERR_STATE *)0x0;
    }
    else {
      iVar1 = CRYPTO_set_thread_local(OPENSSL_THREAD_LOCAL_ERR,value,err_state_free);
      pEVar2 = (ERR_STATE *)0x0;
      if (iVar1 != 0) {
        pEVar2 = value;
      }
    }
  }
  return pEVar2;
}

Assistant:

static ERR_STATE *err_get_state(void) {
  ERR_STATE *state = reinterpret_cast<ERR_STATE *>(
      CRYPTO_get_thread_local(OPENSSL_THREAD_LOCAL_ERR));
  if (state == NULL) {
    state = reinterpret_cast<ERR_STATE *>(malloc(sizeof(ERR_STATE)));
    if (state == NULL) {
      return NULL;
    }
    OPENSSL_memset(state, 0, sizeof(ERR_STATE));
    if (!CRYPTO_set_thread_local(OPENSSL_THREAD_LOCAL_ERR, state,
                                 err_state_free)) {
      return NULL;
    }
  }

  return state;
}